

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_multiply(quaternion *self,quaternion *qT)

{
  undefined1 local_38 [8];
  quaternion r;
  quaternion *qT_local;
  quaternion *self_local;
  
  local_38 = (undefined1  [8])
             (-(self->field_0).q[2] * (qT->field_0).q[1] +
             (self->field_0).q[1] * (qT->field_0).q[2] +
             (self->field_0).q[3] * (qT->field_0).q[0] + (self->field_0).q[0] * (qT->field_0).q[3]);
  r.field_0.q[0] =
       (self->field_0).q[2] * (qT->field_0).q[0] +
       (self->field_0).q[1] * (qT->field_0).q[3] +
       (self->field_0).q[3] * (qT->field_0).q[1] + -((self->field_0).q[0] * (qT->field_0).q[2]);
  r.field_0.q[1] =
       (self->field_0).q[2] * (qT->field_0).q[3] +
       -(self->field_0).q[1] * (qT->field_0).q[0] +
       (self->field_0).q[3] * (qT->field_0).q[2] + (self->field_0).q[0] * (qT->field_0).q[1];
  r.field_0.q[2] =
       -(self->field_0).q[2] * (qT->field_0).q[2] +
       -(self->field_0).q[1] * (qT->field_0).q[1] +
       (self->field_0).q[3] * (qT->field_0).q[3] + -((self->field_0).q[0] * (qT->field_0).q[0]);
  r.field_0.q[3] = (double)qT;
  quaternion_set(self,(quaternion *)local_38);
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_multiply(struct quaternion *self, const struct quaternion *qT)
{
	/* qT is the multiplicand */

	struct quaternion r;

	r.x = self->w * qT->x + self->x * qT->w + self->y * qT->z - self->z * qT->y;
	r.y = self->w * qT->y - self->x * qT->z + self->y * qT->w + self->z * qT->x;
	r.z = self->w * qT->z + self->x * qT->y - self->y * qT->x + self->z * qT->w;
	r.w = self->w * qT->w - self->x * qT->x - self->y * qT->y - self->z * qT->z;

	quaternion_set(self, &r); /* overwrite/save it */

	return self;
}